

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form1_ConvertToGrayScale(ConvertToGrayScaleForm1 ConvertToGrayScale)

{
  uint8_t value;
  bool bVar1;
  Image output;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  
  Unit_Test::intensityArray(&intensity,1);
  value = *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&output,0,0,'\x01','\x01');
  Test_Helper::uniformRGBImage(&input,value,&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  (*ConvertToGrayScale)(&output,&input);
  bVar1 = Unit_Test::verifyImage
                    (&output,*intensity.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&output);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form1_ConvertToGrayScale(ConvertToGrayScaleForm1 ConvertToGrayScale)
    {
        const std::vector < uint8_t > intensity = intensityArray( 1 );
        const PenguinV_Image::Image input = uniformRGBImage( intensity[0] );

        const PenguinV_Image::Image output = ConvertToGrayScale( input );

        return verifyImage( output, intensity[0] );
    }